

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O3

void c_insert(EditLine *el,wchar_t num)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  size_t addlen;
  
  pwVar3 = (el->el_line).lastchar;
  addlen = (size_t)num;
  if ((el->el_line).limit <= pwVar3 + addlen) {
    wVar2 = ch_enlargebufs(el,addlen);
    if (wVar2 == L'\0') {
      return;
    }
    pwVar3 = (el->el_line).lastchar;
  }
  pwVar1 = (el->el_line).cursor;
  pwVar4 = pwVar3;
  if (pwVar1 < pwVar3) {
    do {
      pwVar4[addlen] = *pwVar4;
      pwVar4 = pwVar4 + -1;
    } while (pwVar1 <= pwVar4);
  }
  (el->el_line).lastchar = pwVar3 + addlen;
  return;
}

Assistant:

libedit_private void
c_insert(EditLine *el, int num)
{
	wchar_t *cp;

	if (el->el_line.lastchar + num >= el->el_line.limit) {
		if (!ch_enlargebufs(el, (size_t)num))
			return;		/* can't go past end of buffer */
	}

	if (el->el_line.cursor < el->el_line.lastchar) {
		/* if I must move chars */
		for (cp = el->el_line.lastchar; cp >= el->el_line.cursor; cp--)
			cp[num] = *cp;
	}
	el->el_line.lastchar += num;
}